

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall
ON_TextureMapping::Evaluate(ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  int iVar1;
  ON_Xform *this_00;
  ON_3dPoint local_70;
  ON_3dVector local_58;
  ON_3dPoint local_40;
  
  switch(this->m_type) {
  case srfp_mapping:
    this_00 = &this->m_uvw;
    break;
  default:
    EvaluatePlaneMapping(this,P,N,T);
    return 1;
  case cylinder_mapping:
    iVar1 = EvaluateCylinderMapping(this,P,N,T);
    return iVar1;
  case sphere_mapping:
    EvaluateSphereMapping(this,P,N,T);
    return 1;
  case box_mapping:
    iVar1 = EvaluateBoxMapping(this,P,N,T);
    return iVar1;
  case mesh_mapping_primitive:
  case srf_mapping_primitive:
  case brep_mapping_primitive:
    return 0;
  case wcs_projection:
    this_00 = &this->m_Pxyz;
    break;
  case wcsbox_projection:
    ON_Xform::operator*(&local_40,&this->m_Pxyz,P);
    ON_Xform::operator*(&local_58,&this->m_Nxyz,N);
    ON_Texture::WcsBoxMapping(&local_70,&local_40,&local_58);
    T->z = local_70.z;
    goto LAB_004f3c44;
  }
  ON_Xform::operator*(&local_70,this_00,P);
  T->z = local_70.z;
LAB_004f3c44:
  *(undefined4 *)&T->x = local_70.x._0_4_;
  *(undefined4 *)((long)&T->x + 4) = local_70.x._4_4_;
  *(undefined4 *)&T->y = local_70.y._0_4_;
  *(undefined4 *)((long)&T->y + 4) = local_70.y._4_4_;
  return 1;
}

Assistant:

int ON_TextureMapping::Evaluate(
        const ON_3dPoint& P,
        const ON_3dVector& N,
        ON_3dPoint* T
        ) const
{
  int rc;

	switch(m_type)
	{
	case ON_TextureMapping::TYPE::srfp_mapping:
		*T = m_uvw * P; // Do NOT apply m_Pxyz here.
    rc = 1;
		break;
	case ON_TextureMapping::TYPE::sphere_mapping:
		rc = EvaluateSphereMapping(P,N,T);
		break;
	case ON_TextureMapping::TYPE::cylinder_mapping:
		rc = EvaluateCylinderMapping(P,N,T);
		break;
	case ON_TextureMapping::TYPE::box_mapping:
		rc = EvaluateBoxMapping(P,N,T);
		break;

	case ON_TextureMapping::TYPE::mesh_mapping_primitive:
    rc = 0;
		break;

	case ON_TextureMapping::TYPE::srf_mapping_primitive:
    rc = 0;
		break;

	case ON_TextureMapping::TYPE::brep_mapping_primitive:
    rc = 0;
		break;

  case ON_TextureMapping::TYPE::wcs_projection:
    *T = m_Pxyz * P;
    rc = 1;
    break;

  case ON_TextureMapping::TYPE::wcsbox_projection:
    *T = ON_Texture::WcsBoxMapping(m_Pxyz * P, m_Nxyz * N);
    rc = 1;
    break;

	default:
		rc = EvaluatePlaneMapping(P,N,T);
		break;
	}
  return rc;
}